

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O0

void crnlib::LzmaEnc_Construct(CLzmaEnc *p)

{
  long in_RDI;
  CLzmaEncProps props;
  CMatchFinder *in_stack_ffffffffffffffd0;
  
  RangeEnc_Construct((CRangeEnc *)(in_RDI + 0x3d2e8));
  MatchFinder_Construct(in_stack_ffffffffffffffd0);
  LzmaEncProps_Init((CLzmaEncProps *)&stack0xffffffffffffffc8);
  LzmaEnc_SetProps((CLzmaEncHandle)props._8_8_,(CLzmaEncProps *)props._0_8_);
  LzmaEnc_FastPosInit((Byte *)(in_RDI + 0x304d4));
  LzmaEnc_InitPriceTables((UInt32 *)(in_RDI + 0x324d4));
  *(undefined8 *)(in_RDI + 0x33be0) = 0;
  *(undefined8 *)(in_RDI + 0x3d378) = 0;
  return;
}

Assistant:

void LzmaEnc_Construct(CLzmaEnc* p) {
  RangeEnc_Construct(&p->rc);
  MatchFinder_Construct(&p->matchFinderBase);
#ifdef COMPRESS_MF_MT
  MatchFinderMt_Construct(&p->matchFinderMt);
  p->matchFinderMt.MatchFinder = &p->matchFinderBase;
#endif

  {
    CLzmaEncProps props;
    LzmaEncProps_Init(&props);
    LzmaEnc_SetProps(p, &props);
  }

#ifndef LZMA_LOG_BSR
  LzmaEnc_FastPosInit(p->g_FastPos);
#endif

  LzmaEnc_InitPriceTables(p->ProbPrices);
  p->litProbs = 0;
  p->saveState.litProbs = 0;
}